

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::kotlin::FieldGenerator::GenerateMapField
          (FieldGenerator *this,Printer *printer)

{
  ClassNameResolver *field;
  FieldDescriptor *pFVar1;
  FieldDescriptor *this_00;
  ClassNameResolver *in_RCX;
  long lVar2;
  string_view text;
  Span<const_google::protobuf::io::Printer::Sub> vars;
  allocator<char> local_4da;
  allocator<char> local_4d9;
  JvmNameContext name_ctx;
  _Any_data local_4b8;
  code *local_4a8;
  code *local_4a0;
  char *local_498;
  size_type local_490;
  char local_488 [8];
  undefined8 uStack_480;
  char *local_478;
  size_type local_470;
  char local_468 [8];
  undefined8 uStack_460;
  char *local_458;
  size_type local_450;
  char local_448 [8];
  undefined8 uStack_440;
  char *local_438;
  size_type local_430;
  char local_428 [8];
  undefined8 uStack_420;
  char *local_418;
  size_type local_410;
  char local_408 [8];
  undefined8 uStack_400;
  char *local_3f8;
  size_type local_3f0;
  char local_3e8 [8];
  undefined8 uStack_3e0;
  undefined1 local_3d8 [64];
  __index_type local_398;
  _Alloc_hider local_390;
  size_type local_388;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_380;
  bool local_370;
  bool local_328;
  Sub local_320;
  string local_268;
  string local_248;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  cleanup;
  Options local_210;
  Options local_1c0;
  Options local_170;
  Options local_120;
  Options local_d0;
  Options local_80;
  
  field = java::Context::GetNameResolver(this->context_);
  pFVar1 = java::MapKeyField(this->descriptor_);
  this_00 = java::MapValueField(this->descriptor_);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,"kt_key_type",&local_4da);
  kotlin::(anonymous_namespace)::KotlinTypeName_abi_cxx11_
            ((string *)&local_4b8,(_anonymous_namespace_ *)pFVar1,(FieldDescriptor *)field,in_RCX);
  io::Printer::Sub::Sub<std::__cxx11::string>
            ((Sub *)local_3d8,&local_248,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_4b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_268,"kt_value_type",&local_4d9);
  kotlin::(anonymous_namespace)::KotlinTypeName_abi_cxx11_
            ((string *)&name_ctx,(_anonymous_namespace_ *)this_00,(FieldDescriptor *)field,in_RCX);
  io::Printer::Sub::Sub<std::__cxx11::string>
            (&local_320,&local_268,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&name_ctx);
  vars.len_ = 2;
  vars.ptr_ = (pointer)local_3d8;
  io::Printer::WithVars(&cleanup,printer,vars);
  lVar2 = 0xb8;
  do {
    io::Printer::Sub::~Sub((Sub *)(local_3d8 + lVar2));
    lVar2 = lVar2 + -0xb8;
  } while (lVar2 != -0xb8);
  std::__cxx11::string::~string((string *)&name_ctx);
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::string::~string((string *)local_4b8._M_pod_data);
  std::__cxx11::string::~string((string *)&local_248);
  name_ctx.options = &this->context_->options_;
  name_ctx.lite = this->lite_;
  text._M_str = 
  "/**\n * An uninstantiable, behaviorless type to represent the field in\n * generics.\n */\n@kotlin.OptIn(com.google.protobuf.kotlin.OnlyForUseByGeneratedProtoCode::class)\npublic class ${$$kt_capitalized_name$Proxy$}$ private constructor() : com.google.protobuf.kotlin.DslProxy()\n"
  ;
  text._M_len = 0x113;
  name_ctx.printer = printer;
  io::Printer::Print<>(printer,text);
  pFVar1 = this->descriptor_;
  java::Options::Options(&local_80,&this->context_->options_);
  java::WriteFieldDocComment(printer,pFVar1,&local_80,true);
  java::Options::~Options(&local_80);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f8,"jvm_name",&local_4da);
  local_3d8._8_8_ = local_3f0;
  local_3d8._0_8_ = local_3d8 + 0x10;
  if (local_3f8 == local_3e8) {
    local_3d8._24_8_ = uStack_3e0;
  }
  else {
    local_3d8._0_8_ = local_3f8;
  }
  local_3f0 = 0;
  local_3e8[0] = '\0';
  local_4b8._8_8_ = 0;
  local_4b8._M_unused._M_object = &name_ctx;
  local_4a0 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_invoke;
  local_4a8 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  local_3f8 = local_3e8;
  std::variant<std::__cxx11::string,std::function<bool()>>::
  variant<std::function<bool()>,void,void,std::function<bool()>,void>
            ((variant<std::__cxx11::string,std::function<bool()>> *)(local_3d8 + 0x20),
             (function<bool_()> *)&local_4b8);
  std::_Function_base::~_Function_base((_Function_base *)&local_4b8);
  local_388 = 0;
  local_380._M_local_buf[0] = '\0';
  local_370 = false;
  local_390._M_p = (pointer)&local_380;
  if (local_398 == '\x01') {
    std::__cxx11::string::assign((char *)&local_390);
  }
  local_328 = false;
  io::Printer::Emit(printer,local_3d8,1,0x108,
                    "$kt_deprecation$ public val $kt_name$: com.google.protobuf.kotlin.DslMap<$kt_key_type$, $kt_value_type$, ${$$kt_capitalized_name$Proxy$}$>\n$  jvm_synthetic$$jvm_name$  get() = com.google.protobuf.kotlin.DslMap(\n    $kt_dsl_builder$.${$$kt_property_name$Map$}$\n  )\n"
                   );
  io::Printer::Sub::~Sub((Sub *)local_3d8);
  std::__cxx11::string::~string((string *)&local_3f8);
  pFVar1 = this->descriptor_;
  java::Options::Options(&local_d0,&this->context_->options_);
  java::WriteFieldDocComment(printer,pFVar1,&local_d0,true);
  java::Options::~Options(&local_d0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_418,"jvm_name",&local_4da);
  local_3d8._8_8_ = local_410;
  local_3d8._0_8_ = local_3d8 + 0x10;
  if (local_418 == local_408) {
    local_3d8._24_8_ = uStack_400;
  }
  else {
    local_3d8._0_8_ = local_418;
  }
  local_410 = 0;
  local_408[0] = '\0';
  local_4b8._8_8_ = 0;
  local_4b8._M_unused._M_object = &name_ctx;
  local_4a0 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_invoke;
  local_4a8 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  local_418 = local_408;
  std::variant<std::__cxx11::string,std::function<bool()>>::
  variant<std::function<bool()>,void,void,std::function<bool()>,void>
            ((variant<std::__cxx11::string,std::function<bool()>> *)(local_3d8 + 0x20),
             (function<bool_()> *)&local_4b8);
  std::_Function_base::~_Function_base((_Function_base *)&local_4b8);
  local_388 = 0;
  local_380._M_local_buf[0] = '\0';
  local_370 = false;
  local_390._M_p = (pointer)&local_380;
  if (local_398 == '\x01') {
    std::__cxx11::string::assign((char *)&local_390);
  }
  local_328 = false;
  io::Printer::Emit(printer,local_3d8,1,0xf1,
                    "$jvm_name$public fun com.google.protobuf.kotlin.DslMap<$kt_key_type$, $kt_value_type$, ${$$kt_capitalized_name$Proxy$}$>\n  .put(key: $kt_key_type$, value: $kt_value_type$) {\n     $kt_dsl_builder$.${$put$capitalized_name$$}$(key, value)\n   }\n"
                   );
  io::Printer::Sub::~Sub((Sub *)local_3d8);
  std::__cxx11::string::~string((string *)&local_418);
  pFVar1 = this->descriptor_;
  java::Options::Options(&local_120,&this->context_->options_);
  java::WriteFieldDocComment(printer,pFVar1,&local_120,true);
  java::Options::~Options(&local_120);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_438,"jvm_name",&local_4da);
  local_3d8._8_8_ = local_430;
  local_3d8._0_8_ = local_3d8 + 0x10;
  if (local_438 == local_428) {
    local_3d8._24_8_ = uStack_420;
  }
  else {
    local_3d8._0_8_ = local_438;
  }
  local_430 = 0;
  local_428[0] = '\0';
  local_4b8._8_8_ = 0;
  local_4b8._M_unused._M_object = &name_ctx;
  local_4a0 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_invoke;
  local_4a8 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  local_438 = local_428;
  std::variant<std::__cxx11::string,std::function<bool()>>::
  variant<std::function<bool()>,void,void,std::function<bool()>,void>
            ((variant<std::__cxx11::string,std::function<bool()>> *)(local_3d8 + 0x20),
             (function<bool_()> *)&local_4b8);
  std::_Function_base::~_Function_base((_Function_base *)&local_4b8);
  local_388 = 0;
  local_380._M_local_buf[0] = '\0';
  local_370 = false;
  local_390._M_p = (pointer)&local_380;
  if (local_398 == '\x01') {
    std::__cxx11::string::assign((char *)&local_390);
  }
  local_328 = false;
  io::Printer::Emit(printer,local_3d8,1,0x106,
                    "$jvm_synthetic$$jvm_name$@Suppress(\"NOTHING_TO_INLINE\")\npublic inline operator fun com.google.protobuf.kotlin.DslMap<$kt_key_type$, $kt_value_type$, ${$$kt_capitalized_name$Proxy$}$>\n  .set(key: $kt_key_type$, value: $kt_value_type$) {\n     put(key, value)\n   }\n"
                   );
  io::Printer::Sub::~Sub((Sub *)local_3d8);
  std::__cxx11::string::~string((string *)&local_438);
  pFVar1 = this->descriptor_;
  java::Options::Options(&local_170,&this->context_->options_);
  java::WriteFieldDocComment(printer,pFVar1,&local_170,true);
  java::Options::~Options(&local_170);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_458,"jvm_name",&local_4da);
  local_3d8._8_8_ = local_450;
  local_3d8._0_8_ = local_3d8 + 0x10;
  if (local_458 == local_448) {
    local_3d8._24_8_ = uStack_440;
  }
  else {
    local_3d8._0_8_ = local_458;
  }
  local_450 = 0;
  local_448[0] = '\0';
  local_4b8._8_8_ = 0;
  local_4b8._M_unused._M_object = &name_ctx;
  local_4a0 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_invoke;
  local_4a8 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  local_458 = local_448;
  std::variant<std::__cxx11::string,std::function<bool()>>::
  variant<std::function<bool()>,void,void,std::function<bool()>,void>
            ((variant<std::__cxx11::string,std::function<bool()>> *)(local_3d8 + 0x20),
             (function<bool_()> *)&local_4b8);
  std::_Function_base::~_Function_base((_Function_base *)&local_4b8);
  local_388 = 0;
  local_380._M_local_buf[0] = '\0';
  local_370 = false;
  local_390._M_p = (pointer)&local_380;
  if (local_398 == '\x01') {
    std::__cxx11::string::assign((char *)&local_390);
  }
  local_328 = false;
  io::Printer::Emit(printer,local_3d8,1,0xe7,
                    "$jvm_synthetic$$jvm_name$public fun com.google.protobuf.kotlin.DslMap<$kt_key_type$, $kt_value_type$, ${$$kt_capitalized_name$Proxy$}$>\n  .remove(key: $kt_key_type$) {\n     $kt_dsl_builder$.${$remove$capitalized_name$$}$(key)\n   }\n"
                   );
  io::Printer::Sub::~Sub((Sub *)local_3d8);
  std::__cxx11::string::~string((string *)&local_458);
  pFVar1 = this->descriptor_;
  java::Options::Options(&local_1c0,&this->context_->options_);
  java::WriteFieldDocComment(printer,pFVar1,&local_1c0,true);
  java::Options::~Options(&local_1c0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_478,"jvm_name",&local_4da);
  local_3d8._8_8_ = local_470;
  local_3d8._0_8_ = local_3d8 + 0x10;
  if (local_478 == local_468) {
    local_3d8._24_8_ = uStack_460;
  }
  else {
    local_3d8._0_8_ = local_478;
  }
  local_470 = 0;
  local_468[0] = '\0';
  local_4b8._8_8_ = 0;
  local_4b8._M_unused._M_object = &name_ctx;
  local_4a0 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_invoke;
  local_4a8 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  local_478 = local_468;
  std::variant<std::__cxx11::string,std::function<bool()>>::
  variant<std::function<bool()>,void,void,std::function<bool()>,void>
            ((variant<std::__cxx11::string,std::function<bool()>> *)(local_3d8 + 0x20),
             (function<bool_()> *)&local_4b8);
  std::_Function_base::~_Function_base((_Function_base *)&local_4b8);
  local_388 = 0;
  local_380._M_local_buf[0] = '\0';
  local_370 = false;
  local_390._M_p = (pointer)&local_380;
  if (local_398 == '\x01') {
    std::__cxx11::string::assign((char *)&local_390);
  }
  local_328 = false;
  io::Printer::Emit(printer,local_3d8,1,0x110,
                    "$jvm_synthetic$$jvm_name$public fun com.google.protobuf.kotlin.DslMap<$kt_key_type$, $kt_value_type$, ${$$kt_capitalized_name$Proxy$}$>\n  .putAll(map: kotlin.collections.Map<$kt_key_type$, $kt_value_type$>) {\n     $kt_dsl_builder$.${$putAll$capitalized_name$$}$(map)\n   }\n"
                   );
  io::Printer::Sub::~Sub((Sub *)local_3d8);
  std::__cxx11::string::~string((string *)&local_478);
  pFVar1 = this->descriptor_;
  java::Options::Options(&local_210,&this->context_->options_);
  java::WriteFieldDocComment(printer,pFVar1,&local_210,true);
  java::Options::~Options(&local_210);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_498,"jvm_name",&local_4da);
  local_3d8._8_8_ = local_490;
  local_3d8._0_8_ = local_3d8 + 0x10;
  if (local_498 == local_488) {
    local_3d8._24_8_ = uStack_480;
  }
  else {
    local_3d8._0_8_ = local_498;
  }
  local_490 = 0;
  local_488[0] = '\0';
  local_4b8._8_8_ = 0;
  local_4b8._M_unused._M_object = &name_ctx;
  local_4a0 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_invoke;
  local_4a8 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  local_498 = local_488;
  std::variant<std::__cxx11::string,std::function<bool()>>::
  variant<std::function<bool()>,void,void,std::function<bool()>,void>
            ((variant<std::__cxx11::string,std::function<bool()>> *)(local_3d8 + 0x20),
             (function<bool_()> *)&local_4b8);
  std::_Function_base::~_Function_base((_Function_base *)&local_4b8);
  local_388 = 0;
  local_380._M_local_buf[0] = '\0';
  local_370 = false;
  local_390._M_p = (pointer)&local_380;
  if (local_398 == '\x01') {
    std::__cxx11::string::assign((char *)&local_390);
  }
  local_328 = false;
  io::Printer::Emit(printer,local_3d8,1,0xd0,
                    "$jvm_synthetic$$jvm_name$public fun com.google.protobuf.kotlin.DslMap<$kt_key_type$, $kt_value_type$, ${$$kt_capitalized_name$Proxy$}$>\n  .clear() {\n     $kt_dsl_builder$.${$clear$capitalized_name$$}$()\n   }\n"
                   );
  io::Printer::Sub::~Sub((Sub *)local_3d8);
  std::__cxx11::string::~string((string *)&local_498);
  absl::lts_20250127::
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:1166:28)>
  ::~Cleanup(&cleanup);
  return;
}

Assistant:

void FieldGenerator::GenerateMapField(io::Printer* printer) const {
  auto name_resolver = context_->GetNameResolver();
  const FieldDescriptor* key = java::MapKeyField(descriptor_);
  const FieldDescriptor* value = java::MapValueField(descriptor_);
  auto cleanup = printer->WithVars(
      {{"kt_key_type", KotlinTypeName(key, name_resolver)},
       {"kt_value_type", KotlinTypeName(value, name_resolver)}});

  java::JvmNameContext name_ctx = {context_->options(), printer, lite_};
  printer->Print(
      "/**\n"
      " * An uninstantiable, behaviorless type to represent the field in\n"
      " * generics.\n"
      " */\n"
      "@kotlin.OptIn"
      "(com.google.protobuf.kotlin.OnlyForUseByGeneratedProtoCode::class)\n"
      "public class ${$$kt_capitalized_name$Proxy$}$ private constructor()"
      " : com.google.protobuf.kotlin.DslProxy()\n");

  WriteFieldDocComment(printer, descriptor_, context_->options(),
                       /* kdoc */ true);
  printer->Emit(
      {
          {"jvm_name",
           [&] { JvmName("get$kt_capitalized_name$Map", name_ctx); }},
      },
      "$kt_deprecation$ public val $kt_name$: "
      "com.google.protobuf.kotlin.DslMap"
      "<$kt_key_type$, $kt_value_type$, ${$$kt_capitalized_name$Proxy$}$>\n"
      "$  jvm_synthetic$"
      "$jvm_name$"
      "  get() = com.google.protobuf.kotlin.DslMap(\n"
      "    $kt_dsl_builder$.${$$kt_property_name$Map$}$\n"
      "  )\n");

  WriteFieldDocComment(printer, descriptor_, context_->options(),
                       /* kdoc */ true);
  printer->Emit(
      {
          {"jvm_name", [&] { JvmName("put$kt_capitalized_name$", name_ctx); }},
      },
      "$jvm_name$"
      "public fun com.google.protobuf.kotlin.DslMap"
      "<$kt_key_type$, $kt_value_type$, ${$$kt_capitalized_name$Proxy$}$>\n"
      "  .put(key: $kt_key_type$, value: $kt_value_type$) {\n"
      "     $kt_dsl_builder$.${$put$capitalized_name$$}$(key, value)\n"
      "   }\n");

  WriteFieldDocComment(printer, descriptor_, context_->options(),
                       /* kdoc */ true);
  printer->Emit(
      {
          {"jvm_name", [&] { JvmName("set$kt_capitalized_name$", name_ctx); }},
      },
      "$jvm_synthetic$"
      "$jvm_name$"
      "@Suppress(\"NOTHING_TO_INLINE\")\n"
      "public inline operator fun com.google.protobuf.kotlin.DslMap"
      "<$kt_key_type$, $kt_value_type$, ${$$kt_capitalized_name$Proxy$}$>\n"
      "  .set(key: $kt_key_type$, value: $kt_value_type$) {\n"
      "     put(key, value)\n"
      "   }\n");

  WriteFieldDocComment(printer, descriptor_, context_->options(),
                       /* kdoc */ true);
  printer->Emit(
      {
          {"jvm_name",
           [&] { JvmName("remove$kt_capitalized_name$", name_ctx); }},
      },
      "$jvm_synthetic$"
      "$jvm_name$"
      "public fun com.google.protobuf.kotlin.DslMap"
      "<$kt_key_type$, $kt_value_type$, ${$$kt_capitalized_name$Proxy$}$>\n"
      "  .remove(key: $kt_key_type$) {\n"
      "     $kt_dsl_builder$.${$remove$capitalized_name$$}$(key)\n"
      "   }\n");

  WriteFieldDocComment(printer, descriptor_, context_->options(),
                       /* kdoc */ true);
  printer->Emit(
      {
          {"jvm_name",
           [&] { JvmName("putAll$kt_capitalized_name$", name_ctx); }},
      },
      "$jvm_synthetic$"
      "$jvm_name$"
      "public fun com.google.protobuf.kotlin.DslMap"
      "<$kt_key_type$, $kt_value_type$, ${$$kt_capitalized_name$Proxy$}$>\n"
      "  .putAll(map: kotlin.collections.Map<$kt_key_type$, $kt_value_type$>) "
      "{\n"
      "     $kt_dsl_builder$.${$putAll$capitalized_name$$}$(map)\n"
      "   }\n");

  WriteFieldDocComment(printer, descriptor_, context_->options(),
                       /* kdoc */ true);
  printer->Emit(
      {
          {"jvm_name",
           [&] { JvmName("clear$kt_capitalized_name$", name_ctx); }},
      },
      "$jvm_synthetic$"
      "$jvm_name$"
      "public fun com.google.protobuf.kotlin.DslMap"
      "<$kt_key_type$, $kt_value_type$, ${$$kt_capitalized_name$Proxy$}$>\n"
      "  .clear() {\n"
      "     $kt_dsl_builder$.${$clear$capitalized_name$$}$()\n"
      "   }\n");
}